

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int array_bitset_container_intersection_cardinality
              (array_container_t *src_1,bitset_container_t *src_2)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)src_1->cardinality;
  if (src_1->cardinality < 1) {
    uVar2 = uVar3;
  }
  iVar1 = 0;
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = iVar1 + (uint)((src_2->words[src_1->array[uVar3] >> 6] >>
                            ((ulong)src_1->array[uVar3] & 0x3f) & 1) != 0);
  }
  return iVar1;
}

Assistant:

int array_bitset_container_intersection_cardinality(
    const array_container_t *src_1, const bitset_container_t *src_2) {
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        newcard += bitset_container_contains(src_2, key);
    }
    return newcard;
}